

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O2

void __thiscall ResourceManager::destroy(ResourceManager *this)

{
  pointer ppRVar1;
  Resource *pRVar2;
  ResourceManager *pRVar3;
  __normal_iterator<Resource_**,_std::vector<Resource_*,_std::allocator<Resource_*>_>_> __tmp;
  pointer ppRVar4;
  
  for (ppRVar4 = (this->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      ppRVar1 = (this->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>.
                _M_impl.super__Vector_impl_data._M_start, ppRVar4 != ppRVar1; ppRVar4 = ppRVar4 + -1
      ) {
    pRVar2 = ppRVar4[-1];
    (**pRVar2->_vptr_Resource)(pRVar2);
    (*pRVar2->_vptr_Resource[4])(pRVar2);
  }
  if (ppRVar4 !=
      (this->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar1;
  }
  pRVar3 = rm;
  if (rm != (ResourceManager *)0x0) {
    std::_Vector_base<Resource_*,_std::allocator<Resource_*>_>::~_Vector_base
              ((_Vector_base<Resource_*,_std::allocator<Resource_*>_> *)rm);
  }
  operator_delete(pRVar3,0x18);
  rm = (ResourceManager *)0x0;
  return;
}

Assistant:

void ResourceManager::destroy(void)
{
   std::vector<Resource*>::reverse_iterator it;
  
   for (it = resources.rbegin(); it != resources.rend(); it++) {
      Resource* r = *it;
      r->destroy();
      delete r;
   }

   resources.clear();

   delete rm;
   rm = 0;
}